

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_hor_6tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  __m128i res_00;
  __m128i res_01;
  __m256i res_02;
  int in_ECX;
  int in_EDX;
  uint8_t *puVar1;
  undefined8 uVar2;
  longlong lVar3;
  __m256i res;
  __m256i filt_256 [3];
  __m256i coeffs_256 [3];
  __m128i r_1;
  __m128i r;
  __m128i coeffs_128 [3];
  int16_t *im;
  int32_t y;
  uint8_t *src_ptr;
  __m256i *in_stack_fffffffffffffe00;
  __m256i *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int32_t in_stack_fffffffffffffe14;
  uint8_t *in_stack_fffffffffffffe18;
  __m256i *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int32_t in_stack_fffffffffffffe2c;
  InterpFilterParams *in_stack_fffffffffffffe30;
  ptrdiff_t in_stack_fffffffffffffe38;
  uint8_t *in_stack_fffffffffffffe40;
  int16_t *dst;
  __m128i *in_stack_fffffffffffffe80;
  __m256i *filt;
  ptrdiff_t in_stack_fffffffffffffe88;
  __m256i *coeffs;
  uint8_t *in_stack_fffffffffffffe90;
  __m256i *res_03;
  undefined4 local_7c;
  
  local_7c = in_ECX;
  if (in_EDX < 5) {
    prepare_half_coeffs_6tap_ssse3
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
               (__m128i *)in_stack_fffffffffffffe20);
    if (in_EDX == 2) {
      do {
        x_convolve_6tap_2x2_ssse3
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        res_00[1] = (longlong)in_stack_fffffffffffffe20;
        res_00[0] = (longlong)in_stack_fffffffffffffe18;
        xy_x_round_store_2x2_sse2
                  (res_00,(int16_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        local_7c = local_7c + -2;
      } while (local_7c != 0);
    }
    else if (in_EDX == 4) {
      do {
        x_convolve_6tap_4x2_ssse3
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        res_01[1] = (longlong)in_stack_fffffffffffffe20;
        res_01[0] = (longlong)in_stack_fffffffffffffe18;
        xy_x_round_store_4x2_sse2
                  (res_01,(int16_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        local_7c = local_7c + -2;
      } while (local_7c != 0);
    }
  }
  else {
    dst = (int16_t *)0x807070606050504;
    filt = (__m256i *)0x605050404030302;
    coeffs = (__m256i *)0xa09090808070706;
    res_03 = (__m256i *)0x605050404030302;
    puVar1 = (uint8_t *)0x807070606050504;
    uVar2._0_1_ = '\b';
    uVar2._1_1_ = '\t';
    uVar2._2_1_ = '\t';
    uVar2._3_1_ = '\n';
    uVar2._4_1_ = '\n';
    uVar2._5_1_ = '\v';
    uVar2._6_1_ = '\v';
    uVar2._7_1_ = '\f';
    lVar3 = 0;
    prepare_half_coeffs_6tap_avx2
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    if (in_EDX == 8) {
      do {
        x_convolve_6tap_8x2_avx2
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (__m256i *)in_stack_fffffffffffffe30,
                   (__m256i *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        res_02[1] = (longlong)puVar1;
        res_02[0] = in_stack_fffffffffffffe38;
        res_02[2]._0_1_ = (uint8_t)uVar2;
        res_02[2]._1_1_ = SUB81(uVar2,1);
        res_02[2]._2_1_ = SUB81(uVar2,2);
        res_02[2]._3_1_ = SUB81(uVar2,3);
        res_02[2]._4_1_ = SUB81(uVar2,4);
        res_02[2]._5_1_ = SUB81(uVar2,5);
        res_02[2]._6_1_ = SUB81(uVar2,6);
        res_02[2]._7_1_ = SUB81(uVar2,7);
        res_02[3] = lVar3;
        in_stack_fffffffffffffe40 = puVar1;
        xy_x_round_store_8x2_avx2(res_02,(int16_t *)in_stack_fffffffffffffe30);
        local_7c = local_7c + -2;
      } while (local_7c != 0);
    }
    else if (in_EDX == 0x10) {
      do {
        x_convolve_6tap_16x2_avx2
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                   in_stack_fffffffffffffe00,(__m256i *)0x9b4210);
        xy_x_round_store_32_avx2(res_03,(int16_t *)coeffs);
        local_7c = local_7c + -2;
      } while (local_7c != 0);
    }
    else if (in_EDX == 0x20) {
      do {
        xy_x_6tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        local_7c = local_7c + -1;
      } while (local_7c != 0);
    }
    else if (in_EDX == 0x40) {
      do {
        xy_x_6tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        xy_x_6tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        local_7c = local_7c + -1;
      } while (local_7c != 0);
    }
    else {
      do {
        xy_x_6tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        xy_x_6tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        xy_x_6tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        xy_x_6tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        local_7c = local_7c + -1;
      } while (local_7c != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_6tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 2;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 4) {
    __m128i coeffs_128[3];

    prepare_half_coeffs_6tap_ssse3(filter_params_x, subpel_x_q4, coeffs_128);
    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_6tap_2x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_6tap_4x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256[3], filt_256[3];

    filt_256[0] = _mm256_loadu_si256((__m256i const *)filt1_global_avx2);
    filt_256[1] = _mm256_loadu_si256((__m256i const *)filt2_global_avx2);
    filt_256[2] = _mm256_loadu_si256((__m256i const *)filt3_global_avx2);

    prepare_half_coeffs_6tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);

    if (w == 8) {
      do {
        const __m256i res =
            x_convolve_6tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
        xy_x_round_store_8x2_avx2(res, im);

        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_6tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_6tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_6tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        xy_x_6tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
        xy_x_6tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}